

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void __thiscall disp::h5(disp *this,string *s1,string *s2,string *s3,string *s4,string *s5)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_70,':',s1);
  std::operator+(&local_150,&local_70,':');
  std::operator+(&local_130,&local_150,s2);
  std::operator+(&local_110,&local_130,':');
  std::operator+(&local_f0,&local_110,s3);
  std::operator+(&local_d0,&local_f0,':');
  std::operator+(&local_b0,&local_d0,s4);
  std::operator+(&local_90,&local_b0,':');
  std::operator+(&local_50,&local_90,s5);
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void h5(std::string s1,std::string s2,std::string s3,std::string s4,std::string s5)
	{ v_ = ':'+s1+':'+s2+':'+s3+':'+s4+':'+s5; }